

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_crossed(chunk *c,loc_conflict centre,wchar_t rating)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t y1;
  wchar_t y2;
  loc_conflict lVar8;
  loc lVar9;
  wchar_t wVar10;
  wchar_t x1;
  wchar_t wVar11;
  wchar_t y1_00;
  wchar_t x2;
  wchar_t y1_01;
  wchar_t x2_00;
  wchar_t light;
  wchar_t y2_00;
  loc_conflict centre_local;
  wchar_t local_58;
  
  wVar11 = c->depth;
  centre_local = centre;
  uVar3 = Rand_div(0x19);
  iVar4 = rand_range(3,4);
  iVar5 = rand_range(3,0xb);
  wVar6 = iVar4 * 2 + L'\x03';
  if (iVar4 * 2 + 1 < 3) {
    wVar6 = L'\x05';
  }
  wVar7 = iVar5 * 2 + L'\x03';
  if (iVar5 < 2) {
    wVar7 = L'\x05';
  }
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar6,wVar7);
  local_58 = centre.y;
  if ((c->height <= local_58) || (c->width <= centre.x)) {
    _Var2 = find_space(&centre_local,wVar6,wVar7);
    if (!_Var2) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    local_58 = centre_local.y;
  }
  iVar1 = centre.x;
  wVar6 = iVar1 + L'\xffffffff';
  wVar7 = iVar1 + L'\x01';
  y1 = local_58 + L'\xffffffff';
  y2 = local_58 + L'\x01';
  y1_01 = (local_58 - iVar4) + L'\xffffffff';
  x1 = iVar1 + L'\xfffffffe';
  wVar10 = local_58 + L'\x01' + iVar4;
  x2_00 = iVar1 + L'\x02';
  light = (wchar_t)(wVar11 <= uVar3 + L'\x01');
  generate_room(c,y1_01,x1,wVar10,x2_00,light);
  y1_00 = local_58 + L'\xfffffffe';
  wVar11 = (iVar1 - iVar5) + L'\xffffffff';
  y2_00 = local_58 + L'\x02';
  x2 = iVar1 + 1 + iVar5;
  generate_room(c,y1_00,wVar11,y2_00,x2,light);
  draw_rectangle(c,y1_01,x1,wVar10,x2_00,L'\x15',L'\f',false);
  draw_rectangle(c,y1_00,wVar11,y2_00,x2,L'\x15',L'\f',false);
  wVar11 = L'\x01';
  fill_rectangle(c,local_58 - iVar4,wVar6,local_58 + iVar4,wVar7,L'\x01',L'\0');
  wVar10 = L'\0';
  fill_rectangle(c,y1,iVar1 - iVar5,y2,iVar1 + iVar5,L'\x01',L'\0');
  uVar3 = Rand_div(4);
  if (uVar3 == 3) {
    uVar3 = Rand_div(3);
    if (uVar3 == 0) {
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pinched");
      for (iVar4 = -1; wVar11 = local_58 + iVar4, wVar11 <= y2; iVar4 = iVar4 + 1) {
        if (iVar4 != 0) {
          lVar8 = loc(x1,wVar11);
          set_marked_granite(c,lVar8,L'\v');
          lVar8 = loc(x2_00,wVar11);
          set_marked_granite(c,lVar8,L'\v');
        }
      }
      for (iVar4 = -1; wVar11 = iVar1 + iVar4, wVar11 <= wVar7; iVar4 = iVar4 + 1) {
        if (iVar4 != 0) {
          lVar8 = loc(wVar11,y1_00);
          set_marked_granite(c,lVar8,L'\v');
          lVar8 = loc(wVar11,y2_00);
          set_marked_granite(c,lVar8,L'\v');
        }
      }
      uVar3 = Rand_div(3);
      if (uVar3 == 0) {
        iVar5 = local_58 * 2 >> 1;
        iVar4 = iVar1 * 2 >> 1;
        lVar9 = (loc)loc(iVar4,y1_00);
        square_set_feat((chunk_conflict *)c,lVar9,L'\x02');
        lVar9 = (loc)loc(x1,iVar5);
        square_set_feat((chunk_conflict *)c,lVar9,L'\x02');
        lVar9 = (loc)loc(iVar4,y2_00);
        square_set_feat((chunk_conflict *)c,lVar9,L'\x02');
        lVar9 = (loc)loc(x2_00,iVar5);
        square_set_feat((chunk_conflict *)c,lVar9,L'\x02');
      }
    }
    else {
      uVar3 = Rand_div(3);
      if (uVar3 == 0) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plus");
        generate_plus(c,y1,wVar6,y2,wVar7,wVar11,wVar10);
      }
      else {
        uVar3 = Rand_div(3);
        if (uVar3 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
          set_marked_granite(c,centre_local,L'\v');
        }
      }
    }
  }
  else if (uVar3 == 2) {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"inner vault");
    draw_rectangle(c,y1,wVar6,y2,wVar7,L'\x15',L'\v',false);
    generate_hole(c,y1,wVar6,y2,wVar7,L'\x0f');
    lVar8 = centre_local;
    place_object((chunk_conflict *)c,centre_local,c->depth,false,false,'\x03',L'\0');
    wVar11 = c->depth;
    uVar3 = Rand_div(2);
    vault_monsters((chunk_conflict *)c,lVar8,wVar11 + L'\x02',uVar3 + L'\x03');
    uVar3 = Rand_div(3);
    vault_traps((chunk_conflict *)c,lVar8,L'\x04',L'\x04',uVar3 + L'\x02');
  }
  else if (uVar3 == 1) {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"solid middle");
    fill_rectangle(c,y1,wVar6,y2,wVar7,L'\x15',L'\v');
  }
  return true;
}

Assistant:

bool build_crossed(struct chunk *c, struct loc centre, int rating)
{
	int y, x;
	int height, width;

	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;

	int dy, dx, wy, wx;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Pick inner dimension */
	wy = 1;
	wx = 1;

	/* Pick outer dimension */
	dy = rand_range(3, 4);
	dx = rand_range(3, 11);

	/* Determine extents of room (a) */
	y1a = dy;
	x1a = wx;
	y2a = dy;
	x2a = wx;

	/* Determine extents of room (b) */
	y1b = wy;
	x1b = dx;
	y2b = wy;
	x2b = dx;

	/* Calculate height and width */
	height = MAX(y1a + y2a + 1, y1b + y2b + 1);
	width = MAX(x1a + x2a + 1, x1b + x2b + 1);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if (centre.y >= c->height || centre.x >= c->width) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (b) */
	y1a = centre.y - dy;
	x1a = centre.x - wx;
	y2a = centre.y + dy;
	x2a = centre.x + wx;

	/* locate room (b) */
	y1b = centre.y - wy;
	x1b = centre.x - dx;
	y2b = centre.y + wy;
	x2b = centre.x + dx;

	/* Generate new room (a) */
	generate_room(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, light);

	/* Generate new room (b) */
	generate_room(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	/* Special features */
	switch (randint1(4)) {
		/* Nothing */
	case 1: break;

		/* Large solid middle pillar */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"solid middle");
		fill_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE, SQUARE_WALL_INNER);
		break;
	}

		/* Inner treasure vault */
	case 3: {
		/* Generate a small inner vault */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"inner vault");
		draw_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE,
			SQUARE_WALL_INNER, false);

		/* Open the inner vault with a secret door */
		generate_hole(c, y1b, x1a, y2b, x2a, FEAT_SECRET);

		/* Place a treasure in the vault */
		place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);

		/* Let's guard the treasure well */
		vault_monsters(c, centre, c->depth + 2, randint0(2) + 3);

		/* Traps naturally */
		vault_traps(c, centre, 4, 4, randint0(3) + 2);

		break;
	}

		/* Something else */
	case 4: {
		if (one_in_(3)) {
			/* Occasionally pinch the center shut */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pinched");

			/* Pinch the east/west sides */
			for (y = y1b; y <= y2b; y++) {
				if (y == centre.y) continue;
				set_marked_granite(c, loc(x1a - 1, y), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x2a + 1, y), SQUARE_WALL_INNER);
			}

			/* Pinch the north/south sides */
			for (x = x1a; x <= x2a; x++) {
				if (x == centre.x) continue;
				set_marked_granite(c, loc(x, y1b - 1), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x, y2b + 1), SQUARE_WALL_INNER);
			}

			/* Open sides with doors */
			if (one_in_(3))
				generate_open(c, y1b - 1, x1a - 1, y2b + 1, x2a + 1,
							  FEAT_CLOSED);

		} else if (one_in_(3)) {
			/* Occasionally put a "plus" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"plus");
			generate_plus(c, y1b, x1a, y2b, x2a, 
						  FEAT_GRANITE, SQUARE_WALL_INNER);

		} else if (one_in_(3)) {
			/* Occasionally put a "pillar" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pillar");
			set_marked_granite(c, centre, SQUARE_WALL_INNER);
		}

		break;
	}
	}

	return true;
}